

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplerng.c
# Opt level: O1

double simplerng_getnorm(void)

{
  int iVar1;
  int iVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  if (simplerng_getnorm_saved != '\0') {
    simplerng_getnorm_saved = 0;
    return simplerng_getnorm::y;
  }
  iVar1 = rand();
  iVar2 = rand();
  dVar3 = log((double)iVar1 * 4.656612873077393e-10);
  dVar3 = dVar3 * -2.0;
  if (dVar3 < 0.0) {
    dVar3 = sqrt(dVar3);
  }
  else {
    dVar3 = SQRT(dVar3);
  }
  dVar4 = (double)iVar2 * 4.656612873077393e-10 * 6.283185307179586;
  dVar5 = cos(dVar4);
  simplerng_getnorm::y = dVar5 * dVar3;
  simplerng_getnorm_saved = 1;
  dVar4 = sin(dVar4);
  return dVar4 * dVar3;
}

Assistant:

double simplerng_getnorm()
{
  double u1, u2, r, theta;
  static int saved = 0;
  static double y;

  /* Since you get two deviates for "free" with each calculation, save
     one of them for later */

  if (saved == 0) {
    /* Use Box-Muller algorithm */
    u1 = simplerng_getuniform();
    u2 = simplerng_getuniform();
    r = sqrt( -2.0*log(u1) );
    theta = 2.0*PI*u2;
    /* save second value for next call */
    y = r*cos(theta);
    saved = 1;
    return r*sin(theta);

  } else {
    /* We already saved a value from the last call so use it */
    saved = 0;
    return y;
  }
}